

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithHeartAsTrump.h
# Opt level: O0

void __thiscall WithHeartAsTrump::WithHeartAsTrump(WithHeartAsTrump *this)

{
  initializer_list<Card> __l;
  allocator<Card> local_9d [13];
  Card local_90;
  Card local_88;
  Card local_80;
  Card local_78;
  Card local_70;
  Card local_68;
  Card local_60;
  Card local_58;
  Card local_50;
  Card local_48;
  Card local_40;
  iterator local_38;
  size_type local_30;
  vector<Card,_std::allocator<Card>_> local_28;
  WithHeartAsTrump *local_10;
  WithHeartAsTrump *this_local;
  
  local_10 = this;
  DifferentTrumpRule::DifferentTrumpRule(&this->super_DifferentTrumpRule);
  (this->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)&PTR_isTrump_00127c58;
  Card::Card(&local_90,HEARTS,NINE);
  Card::Card(&local_88,HEARTS,KING);
  Card::Card(&local_80,HEARTS,ASS);
  Card::Card(&local_78,DIAMONDS,JACK);
  Card::Card(&local_70,SPADES,JACK);
  Card::Card(&local_68,CLUBS,JACK);
  Card::Card(&local_60,DIAMONDS,QUEEN);
  Card::Card(&local_58,HEARTS,QUEEN);
  Card::Card(&local_50,SPADES,QUEEN);
  Card::Card(&local_48,CLUBS,QUEEN);
  Card::Card(&local_40,HEARTS,TEN);
  local_38 = &local_90;
  local_30 = 0xb;
  std::allocator<Card>::allocator(local_9d);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<Card,_std::allocator<Card>_>::vector(&local_28,__l,local_9d);
  std::vector<Card,_std::allocator<Card>_>::operator=
            (&(this->super_DifferentTrumpRule).m_trumpCards,&local_28);
  std::vector<Card,_std::allocator<Card>_>::~vector(&local_28);
  std::allocator<Card>::~allocator(local_9d);
  return;
}

Assistant:

WithHeartAsTrump() {
        m_trumpCards = std::vector<Card>{
                Card(Suit::HEARTS, CardValue::NINE),
                Card(Suit::HEARTS, CardValue::KING),
                Card(Suit::HEARTS, CardValue::ASS),
                Card(Suit::DIAMONDS, CardValue::JACK),
                Card(Suit::SPADES, CardValue::JACK),
                Card(Suit::CLUBS, CardValue::JACK),
                Card(Suit::DIAMONDS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::QUEEN),
                Card(Suit::SPADES, CardValue::QUEEN),
                Card(Suit::CLUBS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::TEN)};
    }